

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtr.c
# Opt level: O2

void rtr_purge_outdated_records(rtr_socket *rtr_socket)

{
  int iVar1;
  long in_FS_OFFSET;
  time_t cur_time;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (rtr_socket->last_update != 0) {
    iVar1 = lrtr_get_monotonic_time(&cur_time);
    if (iVar1 == -1) {
      lrtr_dbg("RTR Socket: get_monotic_time(..) failed");
    }
    else if (cur_time <= (long)((ulong)rtr_socket->expire_interval + rtr_socket->last_update))
    goto LAB_0010904f;
    pfx_table_src_remove(rtr_socket->pfx_table,rtr_socket);
    lrtr_dbg("RTR Socket: Removed outdated records from pfx_table");
    spki_table_src_remove(rtr_socket->spki_table,rtr_socket);
    lrtr_dbg("RTR Socket: Removed outdated router keys from spki_table");
    aspa_table_src_remove(rtr_socket->aspa_table,rtr_socket,true);
    lrtr_dbg("RTR Socket: Removed outdated records from aspa_table");
    rtr_socket->request_session_id = true;
    rtr_socket->serial_number = 0;
    rtr_socket->last_update = 0;
    rtr_socket->is_resetting = true;
  }
LAB_0010904f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void rtr_purge_outdated_records(struct rtr_socket *rtr_socket)
{
	if (rtr_socket->last_update == 0)
		return;
	time_t cur_time;
	int rtval = lrtr_get_monotonic_time(&cur_time);

	if (rtval == -1 || (rtr_socket->last_update + rtr_socket->expire_interval) < cur_time) {
		if (rtval == -1)
			RTR_DBG1("get_monotic_time(..) failed");
		pfx_table_src_remove(rtr_socket->pfx_table, rtr_socket);
		RTR_DBG1("Removed outdated records from pfx_table");
		spki_table_src_remove(rtr_socket->spki_table, rtr_socket);
		RTR_DBG1("Removed outdated router keys from spki_table");
		aspa_table_src_remove(rtr_socket->aspa_table, rtr_socket, true);
		RTR_DBG1("Removed outdated records from aspa_table");
		rtr_socket->request_session_id = true;
		rtr_socket->serial_number = 0;
		rtr_socket->last_update = 0;
		rtr_socket->is_resetting = true;
	}
}